

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visualinfo.c
# Opt level: O2

void VisualInfo(GLContext *ctx)

{
  undefined8 uVar1;
  GLContext *pGVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  size_t sStack_60;
  int value;
  long local_48;
  GLContext *local_40;
  int value2;
  int n_fbc;
  
  local_40 = ctx;
  local_48 = (*___glewXGetFBConfigs)(ctx->dpy,*(undefined4 *)(ctx->dpy + 0xe0),&n_fbc);
  if ((local_48 != 0) && (verbose == 0)) {
    fwrite(" +-----+-------------------------+-----------------+----------+-------------+-------+------+\n"
           ,0x5d,1,(FILE *)file);
    fwrite(" |     |        visual           |      color      | ax dp st |    accum    |   ms  |  cav |\n"
           ,0x5d,1,(FILE *)file);
    fwrite(" |  id | tp xr cl fm db st lv xp |  sz  r  g  b  a | bf th cl | r  g  b  a  | ns  b |  eat |\n"
           ,0x5d,1,(FILE *)file);
    fwrite(" +-----+-------------------------+-----------------+----------+-------------+-------+------+\n"
           ,0x5d,1,(FILE *)file);
    for (lVar4 = 0; lVar4 < n_fbc; lVar4 = lVar4 + 1) {
      iVar3 = (*___glewXGetFBConfigAttrib)
                        (local_40->dpy,*(undefined8 *)(local_48 + lVar4 * 8),0x8013,&value);
      if (iVar3 == 0) {
        fprintf((FILE *)file," |% 4d | ",(ulong)(uint)value);
      }
      else {
        fwrite("|  ?  |",7,1,(FILE *)file);
      }
      iVar3 = (*___glewXGetFBConfigAttrib)
                        (local_40->dpy,*(undefined8 *)(local_48 + lVar4 * 8),0x8010,&value);
      if (iVar3 == 0) {
        if ((value & 1U) == 0) {
          if ((value & 4U) == 0) {
            if ((value & 2U) == 0) goto LAB_0010291e;
            pcVar5 = "pm ";
          }
          else {
            pcVar5 = "pb ";
          }
        }
        else if ((value & 4U) == 0) {
          pcVar5 = "wn ";
        }
        else {
          pcVar5 = "wp ";
        }
      }
      else {
LAB_0010291e:
        pcVar5 = " ? ";
      }
      fwrite(pcVar5,3,1,(FILE *)file);
      iVar3 = (*___glewXGetFBConfigAttrib)
                        (local_40->dpy,*(undefined8 *)(local_48 + lVar4 * 8),0x8012,&value);
      if (iVar3 == 0) {
        pcVar5 = " y ";
        if (value == 0) {
          pcVar5 = " n ";
        }
        fprintf((FILE *)file,pcVar5);
      }
      else {
        fwrite(" ? ",3,1,(FILE *)file);
      }
      iVar3 = (*___glewXGetFBConfigAttrib)
                        (local_40->dpy,*(undefined8 *)(local_48 + lVar4 * 8),0x22,&value);
      if (iVar3 == 0) {
        switch(value) {
        case 0x8002:
          pcVar5 = "tc ";
          break;
        case 0x8003:
          pcVar5 = "dc ";
          break;
        case 0x8004:
          pcVar5 = "pc ";
          break;
        case 0x8005:
          pcVar5 = "sc ";
          break;
        case 0x8006:
          pcVar5 = "gs ";
          break;
        case 0x8007:
          pcVar5 = "sg ";
          break;
        default:
          if (value != 0x22) goto LAB_001029db;
          pcVar5 = " . ";
        }
      }
      else {
LAB_001029db:
        pcVar5 = " ? ";
      }
      fwrite(pcVar5,3,1,(FILE *)file);
      iVar3 = (*___glewXGetFBConfigAttrib)
                        (local_40->dpy,*(undefined8 *)(local_48 + lVar4 * 8),0x8011,&value);
      if (iVar3 == 0) {
        if (__GLXEW_NV_float_buffer == '\0') {
          if (((uint)value >> 8 & 1) == 0) goto LAB_00102ab5;
        }
        else {
          iVar3 = (*___glewXGetFBConfigAttrib)
                            (local_40->dpy,*(undefined8 *)(local_48 + lVar4 * 8),0x20b0,&value2);
          if ((iVar3 != 0) || (value2 != 1)) {
LAB_00102ab5:
            if ((value & 1U) == 0) {
              if ((value & 2U) == 0) goto LAB_00102a15;
              pcVar5 = " c ";
            }
            else {
              pcVar5 = " i ";
            }
            goto LAB_00102aef;
          }
        }
        pcVar5 = " f ";
      }
      else {
LAB_00102a15:
        pcVar5 = " ? ";
      }
LAB_00102aef:
      fwrite(pcVar5,3,1,(FILE *)file);
      pGVar2 = local_40;
      iVar3 = (*___glewXGetFBConfigAttrib)
                        (local_40->dpy,*(undefined8 *)(local_48 + lVar4 * 8),5,&value);
      uVar1 = 0x79;
      if (value == 0) {
        uVar1 = 0x2e;
      }
      if (iVar3 != 0) {
        uVar1 = 0x3f;
      }
      fprintf((FILE *)file," %c ",uVar1);
      iVar3 = (*___glewXGetFBConfigAttrib)
                        (pGVar2->dpy,*(undefined8 *)(local_48 + lVar4 * 8),6,&value);
      uVar1 = 0x79;
      if (value == 0) {
        uVar1 = 0x2e;
      }
      if (iVar3 != 0) {
        uVar1 = 0x3f;
      }
      fprintf((FILE *)file," %c ",uVar1);
      iVar3 = (*___glewXGetFBConfigAttrib)
                        (pGVar2->dpy,*(undefined8 *)(local_48 + lVar4 * 8),3,&value);
      if (iVar3 == 0) {
        fprintf((FILE *)file,"%2d ",(ulong)(uint)value);
      }
      else {
        fwrite(" ? ",3,1,(FILE *)file);
      }
      iVar3 = (*___glewXGetFBConfigAttrib)
                        (local_40->dpy,*(undefined8 *)(local_48 + lVar4 * 8),0x23,&value);
      if (iVar3 == 0) {
        if (value == 0x8000) {
          pcVar5 = " . | ";
        }
        else if (value == 0x8009) {
          pcVar5 = " i | ";
        }
        else {
          if (value != 0x8008) goto LAB_00102c0b;
          pcVar5 = " r | ";
        }
      }
      else {
LAB_00102c0b:
        pcVar5 = " ? | ";
      }
      fwrite(pcVar5,5,1,(FILE *)file);
      iVar3 = (*___glewXGetFBConfigAttrib)
                        (local_40->dpy,*(undefined8 *)(local_48 + lVar4 * 8),2,&value);
      if (iVar3 == 0) {
        if (value == 0) {
          pcVar5 = "  . ";
          goto LAB_00102c4a;
        }
        fprintf((FILE *)file,"%3d ");
      }
      else {
        pcVar5 = "  ? ";
LAB_00102c4a:
        fwrite(pcVar5,4,1,(FILE *)file);
      }
      iVar3 = (*___glewXGetFBConfigAttrib)
                        (local_40->dpy,*(undefined8 *)(local_48 + lVar4 * 8),8,&value);
      if (iVar3 == 0) {
        if (value == 0) {
          pcVar5 = "  . ";
          goto LAB_00102cd9;
        }
        fprintf((FILE *)file,"%2d ");
      }
      else {
        pcVar5 = "  ? ";
LAB_00102cd9:
        fwrite(pcVar5 + 1,3,1,(FILE *)file);
      }
      iVar3 = (*___glewXGetFBConfigAttrib)
                        (local_40->dpy,*(undefined8 *)(local_48 + lVar4 * 8),9,&value);
      if (iVar3 == 0) {
        if (value == 0) {
          pcVar5 = "  . ";
          goto LAB_00102d33;
        }
        fprintf((FILE *)file,"%2d ");
      }
      else {
        pcVar5 = "  ? ";
LAB_00102d33:
        fwrite(pcVar5 + 1,3,1,(FILE *)file);
      }
      iVar3 = (*___glewXGetFBConfigAttrib)
                        (local_40->dpy,*(undefined8 *)(local_48 + lVar4 * 8),10,&value);
      if (iVar3 == 0) {
        if (value == 0) {
          pcVar5 = "  . ";
          goto LAB_00102d8d;
        }
        fprintf((FILE *)file,"%2d ");
      }
      else {
        pcVar5 = "  ? ";
LAB_00102d8d:
        fwrite(pcVar5 + 1,3,1,(FILE *)file);
      }
      iVar3 = (*___glewXGetFBConfigAttrib)
                        (local_40->dpy,*(undefined8 *)(local_48 + lVar4 * 8),0xb,&value);
      if (iVar3 == 0) {
        if (value == 0) {
          pcVar5 = " . | ";
          goto LAB_00102de7;
        }
        fprintf((FILE *)file,"%2d | ");
      }
      else {
        pcVar5 = " ? | ";
LAB_00102de7:
        fwrite(pcVar5,5,1,(FILE *)file);
      }
      iVar3 = (*___glewXGetFBConfigAttrib)
                        (local_40->dpy,*(undefined8 *)(local_48 + lVar4 * 8),7,&value);
      if (iVar3 == 0) {
        if (value == 0) {
          pcVar5 = "  . ";
          goto LAB_00102e45;
        }
        fprintf((FILE *)file,"%2d ");
      }
      else {
        pcVar5 = "  ? ";
LAB_00102e45:
        fwrite(pcVar5 + 1,3,1,(FILE *)file);
      }
      iVar3 = (*___glewXGetFBConfigAttrib)
                        (local_40->dpy,*(undefined8 *)(local_48 + lVar4 * 8),0xc,&value);
      if (iVar3 == 0) {
        if (value == 0) {
          pcVar5 = "  . ";
          goto LAB_00102e9f;
        }
        fprintf((FILE *)file,"%2d ");
      }
      else {
        pcVar5 = "  ? ";
LAB_00102e9f:
        fwrite(pcVar5 + 1,3,1,(FILE *)file);
      }
      iVar3 = (*___glewXGetFBConfigAttrib)
                        (local_40->dpy,*(undefined8 *)(local_48 + lVar4 * 8),0xd,&value);
      if (iVar3 == 0) {
        if (value == 0) {
          pcVar5 = " . | ";
          goto LAB_00102ef9;
        }
        fprintf((FILE *)file,"%2d | ");
      }
      else {
        pcVar5 = " ? | ";
LAB_00102ef9:
        fwrite(pcVar5,5,1,(FILE *)file);
      }
      iVar3 = (*___glewXGetFBConfigAttrib)
                        (local_40->dpy,*(undefined8 *)(local_48 + lVar4 * 8),0xe,&value);
      if (iVar3 == 0) {
        if (value == 0) {
          pcVar5 = "  . ";
          goto LAB_00102f57;
        }
        fprintf((FILE *)file,"%2d ");
      }
      else {
        pcVar5 = "  ? ";
LAB_00102f57:
        fwrite(pcVar5 + 1,3,1,(FILE *)file);
      }
      iVar3 = (*___glewXGetFBConfigAttrib)
                        (local_40->dpy,*(undefined8 *)(local_48 + lVar4 * 8),0xf,&value);
      if (iVar3 == 0) {
        if (value == 0) {
          pcVar5 = "  . ";
          goto LAB_00102fb1;
        }
        fprintf((FILE *)file,"%2d ");
      }
      else {
        pcVar5 = "  ? ";
LAB_00102fb1:
        fwrite(pcVar5 + 1,3,1,(FILE *)file);
      }
      iVar3 = (*___glewXGetFBConfigAttrib)
                        (local_40->dpy,*(undefined8 *)(local_48 + lVar4 * 8),0x10,&value);
      if (iVar3 == 0) {
        if (value == 0) {
          pcVar5 = "  . ";
          goto LAB_0010300b;
        }
        fprintf((FILE *)file,"%2d ");
      }
      else {
        pcVar5 = "  ? ";
LAB_0010300b:
        fwrite(pcVar5 + 1,3,1,(FILE *)file);
      }
      iVar3 = (*___glewXGetFBConfigAttrib)
                        (local_40->dpy,*(undefined8 *)(local_48 + lVar4 * 8),0x11,&value);
      if (iVar3 == 0) {
        if (value == 0) {
          pcVar5 = " . | ";
          goto LAB_00103065;
        }
        fprintf((FILE *)file,"%2d | ");
      }
      else {
        pcVar5 = " ? | ";
LAB_00103065:
        fwrite(pcVar5,5,1,(FILE *)file);
      }
      iVar3 = (*___glewXGetFBConfigAttrib)
                        (local_40->dpy,*(undefined8 *)(local_48 + lVar4 * 8),0x186a1,&value);
      if (iVar3 == 0) {
        fprintf((FILE *)file,"%2d ",(ulong)(uint)value);
      }
      else {
        fwrite(" ? ",3,1,(FILE *)file);
      }
      iVar3 = (*___glewXGetFBConfigAttrib)
                        (local_40->dpy,*(undefined8 *)(local_48 + lVar4 * 8),100000,&value);
      if (iVar3 == 0) {
        fprintf((FILE *)file,"%2d | ",(ulong)(uint)value);
      }
      else {
        fwrite(" ? | ",5,1,(FILE *)file);
      }
      iVar3 = (*___glewXGetFBConfigAttrib)
                        (local_40->dpy,*(undefined8 *)(local_48 + lVar4 * 8),0x20,&value);
      if (iVar3 == 0) {
        if (value == 0x800d) {
          pcVar5 = "ncft |\n";
        }
        else if (value == 0x8001) {
          pcVar5 = "slow |\n";
        }
        else if (value == 0x8000) {
          pcVar5 = "none |\n";
        }
        else {
          pcVar5 = "???? |\n";
        }
        sStack_60 = 7;
      }
      else {
        pcVar5 = "???? |";
        sStack_60 = 6;
      }
      fwrite(pcVar5,sStack_60,1,(FILE *)file);
    }
    fwrite(" +-----+-------------------------+-----------------+----------+-------------+-------+------+\n"
           ,0x5d,1,(FILE *)file);
    fwrite(" |  id | tp xr cl fm db st lv xp |  sz  r  g  b  a | bf th cl | r  g  b  a  | ns  b |  eat |\n"
           ,0x5d,1,(FILE *)file);
    fwrite(" |     |        visual           |      color      | ax dp st |    accum    |   ms  |  cav |\n"
           ,0x5d,1,(FILE *)file);
    fwrite(" +-----+-------------------------+-----------------+----------+-------------+-------+------+\n"
           ,0x5d,1,(FILE *)file);
  }
  return;
}

Assistant:

void
VisualInfo (GLContext* ctx)
{
  int n_fbc;
  GLXFBConfig* fbc;
  int value, ret, i;

  fbc = glXGetFBConfigs(ctx->dpy, DefaultScreen(ctx->dpy), &n_fbc);

  if (fbc)
  {
    if (!verbose)
    {
      /* print table header */
      fprintf(file, " +-----+-------------------------+-----------------+----------+-------------+-------+------+\n");
      fprintf(file, " |     |        visual           |      color      | ax dp st |    accum    |   ms  |  cav |\n");
      fprintf(file, " |  id | tp xr cl fm db st lv xp |  sz  r  g  b  a | bf th cl | r  g  b  a  | ns  b |  eat |\n");
      fprintf(file, " +-----+-------------------------+-----------------+----------+-------------+-------+------+\n");
      /* loop through all the fbcs */
      for (i=0; i<n_fbc; i++)
      {
        /* print out the information for this fbc */
        /* visual id */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_FBCONFIG_ID, &value);
        if (ret != Success)
        {
          fprintf(file, "|  ?  |");
        }
        else
        {
          fprintf(file, " |% 4d | ", value);
        }
        /* visual type */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_DRAWABLE_TYPE, &value);
        if (ret != Success)
        {
          fprintf(file, " ? ");
        }
        else
        {
          if (value & GLX_WINDOW_BIT)
          {
            if (value & GLX_PBUFFER_BIT)
            {
              fprintf(file, "wp ");
            }
            else
            {
              fprintf(file, "wn ");
            }
          }
          else
          {
            if (value & GLX_PBUFFER_BIT)
            {
              fprintf(file, "pb ");
            }
            else if (value & GLX_PIXMAP_BIT)
            {
              fprintf(file, "pm ");
            }
            else
            {
              fprintf(file, " ? ");
            }
          }
        }
        /* x renderable */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_X_RENDERABLE, &value);
        if (ret != Success)
        {
          fprintf(file, " ? ");
        }
        else
        {
          fprintf(file, value ? " y " : " n ");
        }
        /* class */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_X_VISUAL_TYPE, &value);
        if (ret != Success)
        {
          fprintf(file, " ? ");
        }
        else
        {
          if (GLX_TRUE_COLOR == value)
            fprintf(file, "tc ");
          else if (GLX_DIRECT_COLOR == value)
            fprintf(file, "dc ");
          else if (GLX_PSEUDO_COLOR == value)
            fprintf(file, "pc ");
          else if (GLX_STATIC_COLOR == value)
            fprintf(file, "sc ");
          else if (GLX_GRAY_SCALE == value)
            fprintf(file, "gs ");
          else if (GLX_STATIC_GRAY == value)
            fprintf(file, "sg ");
          else if (GLX_X_VISUAL_TYPE == value)
            fprintf(file, " . ");
          else
            fprintf(file, " ? ");
        }
        /* format */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_RENDER_TYPE, &value);
        if (ret != Success)
        {
          fprintf(file, " ? ");
        }
        else
        {
          if (GLXEW_NV_float_buffer)
          {
            int ret2, value2;
            ret2 = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_FLOAT_COMPONENTS_NV, &value2);
            if (Success == ret2 && GL_TRUE == value2)
            {
              fprintf(file, " f ");
            }
            else if (value & GLX_RGBA_BIT)
              fprintf(file, " i ");
            else if (value & GLX_COLOR_INDEX_BIT)
              fprintf(file, " c ");
            else
              fprintf(file, " ? ");
          }
          else
          {
            if (value & GLX_RGBA_FLOAT_ATI_BIT)
              fprintf(file, " f ");
            else if (value & GLX_RGBA_BIT)
              fprintf(file, " i ");
            else if (value & GLX_COLOR_INDEX_BIT)
              fprintf(file, " c ");
            else
              fprintf(file, " ? ");
          }
        }
        /* double buffer */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_DOUBLEBUFFER, &value);
        fprintf(file, " %c ", Success != ret ? '?' : (value ? 'y' : '.'));
        /* stereo */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_STEREO, &value);
        fprintf(file, " %c ", Success != ret ? '?' : (value ? 'y' : '.'));
        /* level */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_LEVEL, &value);
        if (Success != ret)
        {
          fprintf(file, " ? ");
        }
        else
        {
          fprintf(file, "%2d ", value);
        }
        /* transparency */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_TRANSPARENT_TYPE, &value);
        if (Success != ret)
        {
          fprintf(file, " ? | ");
        }
        else
        {
          if (GLX_TRANSPARENT_RGB == value)
            fprintf(file, " r | ");
          else if (GLX_TRANSPARENT_INDEX == value)
            fprintf(file, " i | ");
          else if (GLX_NONE == value)
            fprintf(file, " . | ");
          else
            fprintf(file, " ? | ");
        }
        /* color size */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_BUFFER_SIZE, &value);
        if (Success != ret)
        {
          fprintf(file, "  ? ");
        }
        else
        {
          if (value)
            fprintf(file, "%3d ", value);
          else
            fprintf(file, "  . ");
        }
        /* red size */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_RED_SIZE, &value);
        if (Success != ret)
        {
          fprintf(file, " ? ");
        }
        else
        {
          if (value)
            fprintf(file, "%2d ", value);
          else
            fprintf(file, " . ");
        }
        /* green size */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_GREEN_SIZE, &value);
        if (Success != ret)
        {
          fprintf(file, " ? ");
        }
        else
        {
          if (value)
            fprintf(file, "%2d ", value);
          else
            fprintf(file, " . ");
        }
        /* blue size */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_BLUE_SIZE, &value);
        if (Success != ret)
        {
          fprintf(file, " ? ");
        }
        else
        {
          if (value)
            fprintf(file, "%2d ", value);
          else
            fprintf(file, " . ");
        }
        /* alpha size */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_ALPHA_SIZE, &value);
        if (Success != ret)
        {
          fprintf(file, " ? | ");
        }
        else
        {
          if (value)
            fprintf(file, "%2d | ", value);
          else
            fprintf(file, " . | ");
        }
        /* aux buffers */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_AUX_BUFFERS, &value);
        if (Success != ret)
        {
          fprintf(file, " ? ");
        }
        else
        {
          if (value)
            fprintf(file, "%2d ", value);
          else
            fprintf(file, " . ");
        }
        /* depth size */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_DEPTH_SIZE, &value);
        if (Success != ret)
        {
          fprintf(file, " ? ");
        }
        else
        {
          if (value)
            fprintf(file, "%2d ", value);
          else
            fprintf(file, " . ");
        }
        /* stencil size */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_STENCIL_SIZE, &value);
        if (Success != ret)
        {
          fprintf(file, " ? | ");
        }
        else
        {
          if (value)
            fprintf(file, "%2d | ", value);
          else
            fprintf(file, " . | ");
        }
        /* accum red size */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_ACCUM_RED_SIZE, &value);
        if (Success != ret)
        {
          fprintf(file, " ? ");
        }
        else
        {
          if (value)
            fprintf(file, "%2d ", value);
          else
            fprintf(file, " . ");
        }
        /* accum green size */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_ACCUM_GREEN_SIZE, &value);
        if (Success != ret)
        {
          fprintf(file, " ? ");
        }
        else
        {
          if (value)
            fprintf(file, "%2d ", value);
          else
            fprintf(file, " . ");
        }
        /* accum blue size */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_ACCUM_BLUE_SIZE, &value);
        if (Success != ret)
        {
          fprintf(file, " ? ");
        }
        else
        {
          if (value)
            fprintf(file, "%2d ", value);
          else
            fprintf(file, " . ");
        }
        /* accum alpha size */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_ACCUM_ALPHA_SIZE, &value);
        if (Success != ret)
        {
          fprintf(file, " ? | ");
        }
        else
        {
          if (value)
            fprintf(file, "%2d | ", value);
          else
            fprintf(file, " . | ");
        }
        /* multisample */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_SAMPLES, &value);
        if (Success != ret)
        {
          fprintf(file, " ? ");
        }
        else
        {
          fprintf(file, "%2d ", value);
        }
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_SAMPLE_BUFFERS, &value);
        if (Success != ret)
        {
          fprintf(file, " ? | ");
        }
        else
        {
          fprintf(file, "%2d | ", value);
        }
        /* caveat */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_CONFIG_CAVEAT, &value);
        if (Success != ret)
        {
          fprintf(file, "???? |");
        }
        else
        {
          if (GLX_NONE == value)
            fprintf(file, "none |\n");
          else if (GLX_SLOW_CONFIG == value)
            fprintf(file, "slow |\n");
          else if (GLX_NON_CONFORMANT_CONFIG == value)
            fprintf(file, "ncft |\n");
          else
            fprintf(file, "???? |\n");
        }
      }
      /* print table footer */
      fprintf(file, " +-----+-------------------------+-----------------+----------+-------------+-------+------+\n");
      fprintf(file, " |  id | tp xr cl fm db st lv xp |  sz  r  g  b  a | bf th cl | r  g  b  a  | ns  b |  eat |\n");
      fprintf(file, " |     |        visual           |      color      | ax dp st |    accum    |   ms  |  cav |\n");
      fprintf(file, " +-----+-------------------------+-----------------+----------+-------------+-------+------+\n");
    }
  }
}